

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O3

void __thiscall RTIMUMagCal::setMinMaxCal(RTIMUMagCal *this)

{
  float fVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  
  lVar2 = -3;
  fVar3 = -1.0;
  do {
    fVar4 = *(float *)((long)(&this->m_magMax + 1) + lVar2 * 4) - (this->m_magMax).m_data[lVar2];
    if (fVar4 <= fVar3) {
      fVar4 = fVar3;
    }
    lVar2 = lVar2 + 1;
    fVar3 = fVar4;
  } while (lVar2 != 0);
  if (fVar4 < 0.0) {
    setMinMaxCal();
  }
  else {
    lVar2 = -3;
    do {
      fVar3 = (this->m_magMax).m_data[lVar2];
      fVar1 = *(float *)((long)(&this->m_magMax + 1) + lVar2 * 4);
      this->m_octantCounts[lVar2] = (int)((fVar4 * 0.5) / ((fVar1 - fVar3) * 0.5));
      (this->m_minMaxScale).m_data[lVar2] = (fVar1 + fVar3) * 0.5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void RTIMUMagCal::setMinMaxCal()
{
    float maxDelta = -1;
    float delta;

    //  find biggest range

    for (int i = 0; i < 3; i++) {
        if ((m_magMax.data(i) - m_magMin.data(i)) > maxDelta)
            maxDelta = m_magMax.data(i) - m_magMin.data(i);
    }
    if (maxDelta < 0) {
        HAL_ERROR("Error in min/max calibration data\n");
        return;
    }
    maxDelta /= 2.0f;                                       // this is the max +/- range

    for (int i = 0; i < 3; i++) {
        delta = (m_magMax.data(i) -m_magMin.data(i)) / 2.0f;
        m_minMaxScale.setData(i, maxDelta / delta);            // makes everything the same range
        m_minMaxOffset.setData(i, (m_magMax.data(i) + m_magMin.data(i)) / 2.0f);
    }
}